

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Butterworth.cpp
# Opt level: O1

void __thiscall
Iir::Butterworth::BandPassBase::setup
          (BandPassBase *this,int order,double centerFrequency,double widthFrequency)

{
  AnalogLowPass *this_00;
  LayoutBase *digital;
  BandPassTransform local_58;
  
  this_00 = &(this->super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>).m_analogProto;
  AnalogLowPass::design(this_00,order);
  digital = &(this->super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>).super_PoleFilterBase2.
             m_digitalProto;
  BandPassTransform::BandPassTransform
            (&local_58,centerFrequency,widthFrequency,digital,&this_00->super_LayoutBase);
  Cascade::setLayout((Cascade *)this,digital);
  return;
}

Assistant:

void BandPassBase::setup (int order,
                          double centerFrequency,
                          double widthFrequency)
{
  m_analogProto.design (order);

  BandPassTransform (centerFrequency,
                     widthFrequency,
                     m_digitalProto,
                     m_analogProto);

  Cascade::setLayout (m_digitalProto);
}